

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArrayImageTextureSize.cpp
# Opt level: O0

void __thiscall
glcts::TextureCubeMapArrayTextureSizeRTComputeShader::configureProgram
          (TextureCubeMapArrayTextureSizeRTComputeShader *this)

{
  bool bVar1;
  int iVar2;
  undefined4 uVar3;
  deUint32 err;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  TestError *this_00;
  char *local_20;
  char *csCode;
  Functions *gl;
  TextureCubeMapArrayTextureSizeRTComputeShader *this_local;
  
  gl = (Functions *)this;
  pRVar4 = deqp::Context::getRenderContext
                     ((this->super_TextureCubeMapArrayTextureSizeRTBase).
                      super_TextureCubeMapArrayTextureSizeBase.super_TestCaseBase.m_context);
  iVar2 = (*pRVar4->_vptr_RenderContext[3])();
  csCode = (char *)CONCAT44(extraout_var,iVar2);
  local_20 = getComputeShaderCode(this);
  uVar3 = (**(code **)(csCode + 0x3f0))(0x91b9);
  *(undefined4 *)&(this->super_TextureCubeMapArrayTextureSizeRTBase).field_0x2cc = uVar3;
  err = (**(code **)(csCode + 0x800))();
  glu::checkError(err,"Could not create shader object.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageTextureSize.cpp"
                  ,0x5bc);
  bVar1 = TestCaseBase::buildProgram
                    ((TestCaseBase *)this,
                     (this->super_TextureCubeMapArrayTextureSizeRTBase).
                     super_TextureCubeMapArrayTextureSizeBase.m_po_id,
                     *(GLuint *)&(this->super_TextureCubeMapArrayTextureSizeRTBase).field_0x2cc,1,
                     &local_20,(bool *)0x0);
  if (!bVar1) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Could not compile/link program object from valid shader code.",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageTextureSize.cpp"
               ,0x5c1);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  return;
}

Assistant:

void TextureCubeMapArrayTextureSizeRTComputeShader::configureProgram(void)
{
	/* Get GL entry points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	const char* csCode = getComputeShaderCode();

	m_cs_id = gl.createShader(GL_COMPUTE_SHADER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not create shader object.");

	/* Build program */
	if (!buildProgram(m_po_id, m_cs_id, 1 /* part */, &csCode))
	{
		TCU_FAIL("Could not compile/link program object from valid shader code.");
	}
}